

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::setPlatformMenu(QMenuPrivate *this,QPlatformMenu *menu)

{
  bool bVar1;
  QMenu *pQVar2;
  QObject *pQVar3;
  QPlatformMenu *pQVar4;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *q;
  QPlatformMenu *in_stack_ffffffffffffffb8;
  QPlatformMenu *in_stack_ffffffffffffffc0;
  Connection local_18;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar1 = QPointer<QPlatformMenu>::isNull((QPointer<QPlatformMenu> *)0x63e9f5);
  if (!bVar1) {
    QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x63ea0a);
    pQVar3 = QObject::parent((QObject *)0x63ea12);
    if ((pQVar3 == (QObject *)0x0) &&
       (in_stack_ffffffffffffffc0 =
             QPointer<QPlatformMenu>::data((QPointer<QPlatformMenu> *)0x63ea29),
       in_stack_ffffffffffffffc0 != (QPlatformMenu *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffffc0 + 0x20))();
    }
  }
  QPointer<QPlatformMenu>::operator=
            ((QPointer<QPlatformMenu> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = QPointer<QPlatformMenu>::isNull((QPointer<QPlatformMenu> *)0x63ea68);
  if (!bVar1) {
    pQVar4 = ::QPointer::operator_cast_to_QPlatformMenu_((QPointer<QPlatformMenu> *)0x63ea7d);
    QObject::connect((QObject *)&local_10,(char *)pQVar4,(QObject *)"2aboutToShow()",(char *)pQVar2,
                     0xb2061f);
    QMetaObject::Connection::~Connection(&local_10);
    pQVar4 = ::QPointer::operator_cast_to_QPlatformMenu_((QPointer<QPlatformMenu> *)0x63eabb);
    QObject::connect((QObject *)&local_18,(char *)pQVar4,(QObject *)"2aboutToHide()",(char *)pQVar2,
                     0xb2063d);
    QMetaObject::Connection::~Connection(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::setPlatformMenu(QPlatformMenu *menu)
{
    Q_Q(QMenu);
    if (!platformMenu.isNull() && !platformMenu->parent())
        delete platformMenu.data();

    platformMenu = menu;
    if (!platformMenu.isNull()) {
        QObject::connect(platformMenu, SIGNAL(aboutToShow()), q, SLOT(_q_platformMenuAboutToShow()));
        QObject::connect(platformMenu, SIGNAL(aboutToHide()), q, SIGNAL(aboutToHide()));
    }
}